

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O0

void __thiscall
Pl_Function::Pl_Function(Pl_Function *this,char *identifier,Pipeline *next,writer_t *fn)

{
  writer_t *fn_local;
  Pipeline *next_local;
  char *identifier_local;
  Pl_Function *this_local;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_0058e3b8;
  std::make_unique<Pl_Function::Members,std::function<void(unsigned_char_const*,unsigned_long)>&>
            ((function<void_(const_unsigned_char_*,_unsigned_long)> *)&this->m);
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_t fn) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(fn))
{
}